

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordLearner.cc
# Opt level: O2

void __thiscall
onmt::SubwordLearner::learn(SubwordLearner *this,string *model_path,char *description,bool verbose)

{
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_248;
  ofstream out;
  byte abStack_208 [480];
  
  std::ofstream::ofstream(&out,(string *)model_path,_S_out);
  if ((abStack_208[*(long *)(_out + -0x18)] & 5) == 0) {
    (*this->_vptr_SubwordLearner[6])(this,&out,description,(ulong)verbose);
    std::ofstream::~ofstream(&out);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_248,"Failed to open model path ",model_path);
  std::invalid_argument::invalid_argument(this_00,(string *)&bStack_248);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void SubwordLearner::learn(const std::string& model_path, const char* description, bool verbose)
  {
    std::ofstream out(model_path);
    if (!out)
      throw std::invalid_argument("Failed to open model path " + model_path);
    learn(out, description, verbose);
  }